

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenerator::InfoT::GetBool(InfoT *this,string *key,bool *value,bool required)

{
  bool bVar1;
  string local_68;
  string_view local_48;
  Value *local_38;
  Value *jval;
  bool *pbStack_28;
  bool required_local;
  bool *value_local;
  string *key_local;
  InfoT *this_local;
  
  jval._7_1_ = required;
  pbStack_28 = value;
  value_local = (bool *)key;
  key_local = (string *)this;
  local_38 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isBool(local_38);
  if (bVar1) {
    bVar1 = Json::Value::asBool(local_38);
    *pbStack_28 = bVar1;
  }
  else {
    bVar1 = Json::Value::isNull(local_38);
    if ((!bVar1) || ((jval._7_1_ & 1) != 0)) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
                (&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local,
                 (char (*) [19])" is not a boolean.");
      local_48 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
      this_local._7_1_ = LogError(this,local_48);
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_009ad675;
    }
  }
  this_local._7_1_ = 1;
LAB_009ad675:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetBool(std::string const& key, bool& value,
                                       bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (jval.isBool()) {
    value = jval.asBool();
  } else {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not a boolean."));
    }
  }
  return true;
}